

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3Realloc(void *pOld,int nBytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *local_30;
  void *pNew;
  int nDiff;
  int nNew;
  int nOld;
  int nBytes_local;
  void *pOld_local;
  
  if (pOld == (void *)0x0) {
    pOld_local = sqlite3Malloc(nBytes);
  }
  else if (nBytes < 1) {
    sqlite3_free(pOld);
    pOld_local = (void *)0x0;
  }
  else if (nBytes < 0x7fffff00) {
    iVar1 = sqlite3MallocSize(pOld);
    iVar2 = (*sqlite3Config.m.xRoundup)(nBytes);
    local_30 = pOld;
    if (iVar1 != iVar2) {
      if (sqlite3Config.bMemstat == 0) {
        local_30 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
      }
      else {
        sqlite3_mutex_enter(mem0.mutex);
        sqlite3StatusSet(5,nBytes);
        iVar3 = sqlite3StatusValue(0);
        if (mem0.alarmThreshold - (iVar2 - iVar1) <= (long)iVar3) {
          sqlite3MallocAlarm(iVar2 - iVar1);
        }
        local_30 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
        if ((local_30 == (void *)0x0) &&
           (mem0.alarmCallback != (_func_void_void_ptr_sqlite3_int64_int *)0x0)) {
          sqlite3MallocAlarm(nBytes);
          local_30 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
        }
        if (local_30 != (void *)0x0) {
          iVar2 = sqlite3MallocSize(local_30);
          sqlite3StatusAdd(0,iVar2 - iVar1);
        }
        sqlite3_mutex_leave(mem0.mutex);
      }
    }
    pOld_local = local_30;
  }
  else {
    pOld_local = (void *)0x0;
  }
  return pOld_local;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Realloc(void *pOld, int nBytes){
  int nOld, nNew, nDiff;
  void *pNew;
  if( pOld==0 ){
    return sqlite3Malloc(nBytes); /* IMP: R-28354-25769 */
  }
  if( nBytes<=0 ){
    sqlite3_free(pOld); /* IMP: R-31593-10574 */
    return 0;
  }
  if( nBytes>=0x7fffff00 ){
    /* The 0x7ffff00 limit term is explained in comments on sqlite3Malloc() */
    return 0;
  }
  nOld = sqlite3MallocSize(pOld);
  /* IMPLEMENTATION-OF: R-46199-30249 SQLite guarantees that the second
  ** argument to xRealloc is always a value returned by a prior call to
  ** xRoundup. */
  nNew = sqlite3GlobalConfig.m.xRoundup(nBytes);
  if( nOld==nNew ){
    pNew = pOld;
  }else if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    sqlite3StatusSet(SQLITE_STATUS_MALLOC_SIZE, nBytes);
    nDiff = nNew - nOld;
    if( sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED) >= 
          mem0.alarmThreshold-nDiff ){
      sqlite3MallocAlarm(nDiff);
    }
    assert( sqlite3MemdebugHasType(pOld, MEMTYPE_HEAP) );
    assert( sqlite3MemdebugNoType(pOld, ~MEMTYPE_HEAP) );
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
    if( pNew==0 && mem0.alarmCallback ){
      sqlite3MallocAlarm(nBytes);
      pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
    }
    if( pNew ){
      nNew = sqlite3MallocSize(pNew);
      sqlite3StatusAdd(SQLITE_STATUS_MEMORY_USED, nNew-nOld);
    }
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
  }
  assert( EIGHT_BYTE_ALIGNMENT(pNew) ); /* IMP: R-04675-44850 */
  return pNew;
}